

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

bool parse_line_json<false>(vw *all,char *line,size_t num_chars,v_array<example_*> *examples)

{
  size_type sVar1;
  char *in_RSI;
  example **in_RDI;
  DecisionServiceInteraction interaction;
  void *in_stack_000001d0;
  example_factory_t in_stack_000001d8;
  char *in_stack_000001e0;
  v_array<example_*> *in_stack_000001e8;
  vw *in_stack_000001f0;
  example_factory_t in_stack_00000418;
  undefined1 in_stack_00000427;
  size_t in_stack_00000428;
  char *in_stack_00000430;
  v_array<example_*> *in_stack_00000438;
  vw *in_stack_00000440;
  void *in_stack_00000450;
  DecisionServiceInteraction *in_stack_00000458;
  DecisionServiceInteraction *in_stack_ffffffffffffff40;
  vw *all_00;
  vw *examples_00;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar2;
  undefined1 local_80 [84];
  bool local_2c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_10;
  
  if (((ulong)(in_RDI[1]->super_example_predict).feature_space[8].indicies._begin & 0x100) == 0) {
    VW::read_line_json<false>
              (in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,in_stack_000001d8,
               in_stack_000001d0);
  }
  else {
    if (*in_RSI != '{') {
      local_10._M_local_buf[0xf] = 0;
      goto LAB_00302e06;
    }
    all_00 = (vw *)local_80;
    local_10._M_allocated_capacity = (size_type)in_RDI;
    DecisionServiceInteraction::DecisionServiceInteraction(in_stack_ffffffffffffff40);
    examples_00 = all_00;
    VW::read_line_decision_service_json<false>
              (in_stack_00000440,in_stack_00000438,in_stack_00000430,in_stack_00000428,
               (bool)in_stack_00000427,in_stack_00000418,in_stack_00000450,in_stack_00000458);
    if ((local_2c & 1U) == 0) {
      sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_80 + 0x20));
      if (sVar1 == 0) {
        local_10._M_local_buf[0xf] = 0;
        iVar2 = 1;
      }
      else {
        iVar2 = 0;
      }
    }
    else {
      VW::return_multiple_example
                ((vw *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (v_array<example_*> *)examples_00);
      VW::get_unused_example(all_00);
      v_array<example_*>::push_back
                ((v_array<example_*> *)all_00,(example **)local_10._M_allocated_capacity);
      local_10._M_local_buf[0xf] = 0;
      iVar2 = 1;
    }
    DecisionServiceInteraction::~DecisionServiceInteraction((DecisionServiceInteraction *)all_00);
    if (iVar2 != 0) goto LAB_00302e06;
  }
  local_10._M_local_buf[0xf] = 1;
LAB_00302e06:
  return (bool)(local_10._M_local_buf[0xf] & 1);
}

Assistant:

bool parse_line_json(vw* all, char* line, size_t num_chars, v_array<example*>& examples)
{
  if (all->p->decision_service_json)
  {
    // Skip lines that do not start with "{"
    if (line[0] != '{')
    {
      return false;
    }

    DecisionServiceInteraction interaction;
    VW::template read_line_decision_service_json<audit>(*all, examples, line, num_chars, false,
        reinterpret_cast<VW::example_factory_t>(&VW::get_unused_example), all, &interaction);

    // TODO: In refactoring the parser to be usable standalone, we need to ensure that we
    // stop suppressing "skipLearn" interactions. Also, not sure if this is the right logic
    // for counterfactual. (@marco)
    if (interaction.skipLearn)
    {
      VW::return_multiple_example(*all, examples);
      examples.push_back(&VW::get_unused_example(all));
      return false;
    }

    // let's ask to continue reading data until we find a line with actions provided
    if (interaction.actions.size() == 0)
    {
      //VW::return_multiple_example(*all, examples);
      //examples.push_back(&VW::get_unused_example(all));
      return false;
    }
  }
  else
    VW::template read_line_json<audit>(
        *all, examples, line, reinterpret_cast<VW::example_factory_t>(&VW::get_unused_example), all);

  return true;
}